

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerResults.cpp
# Opt level: O1

void __thiscall
ModbusAnalyzerResults::GenerateBubbleText
          (ModbusAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  Mode MVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  ulong uVar8;
  uint uVar9;
  char DeviceAddrStr [128];
  char FunctionCodeStr [128];
  char Payload1Str [128];
  char Payload2Str [128];
  char result_str [256];
  Frame frame;
  char ChecksumStr [128];
  char Payload3Str [128];
  char Payload4Str [128];
  char local_4e8 [128];
  char local_468 [128];
  char local_3e8 [128];
  char local_368 [128];
  char local_2e8 [8];
  char acStack_2e0 [5];
  undefined8 auStack_2db [31];
  Frame local_1e0 [16];
  ushort local_1d0;
  ushort uStack_1ce;
  undefined4 uStack_1cc;
  ushort local_1c8;
  ushort local_1c6;
  byte local_1bf;
  char local_1b8 [128];
  char local_138 [128];
  char local_b8 [136];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_1e0);
  bVar2 = local_1bf;
  MVar1 = this->mSettings->mModbusMode;
  uVar9 = this->mSettings->mBitsPerTransfer - (uint)(MVar1 != Normal);
  if (ModbusASCIIServer < MVar1) {
    pcVar6 = local_2e8;
    AnalyzerHelpers::GetNumberString
              (CONCAT44(uStack_1cc,CONCAT22(uStack_1ce,local_1d0)),display_base,uVar9,pcVar6,0x80);
    if ((local_1bf & 4) == 0) {
      if (((bVar2 & 2) != 0) || ((bVar2 & 1) != 0)) {
        AnalyzerResults::AddResultString
                  ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        sprintf(local_4e8,"%s (error)",local_2e8);
        AnalyzerResults::AddResultString
                  ((char *)this,local_4e8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((bVar2 & 3) == 2) {
          pcVar5 = "%s (parity error)";
        }
        else if (((bVar2 & 2) == 0) && ((bVar2 & 1) != 0)) {
          pcVar5 = "%s (framing error)";
        }
        else {
          pcVar5 = "%s (framing error & parity error)";
        }
        goto LAB_0010c2e7;
      }
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,"A",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"Addr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((bVar2 & 1) == 0) {
        sprintf(local_4e8,"Addr: %s",local_2e8);
        AnalyzerResults::AddResultString
                  ((char *)this,local_4e8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        pcVar5 = "Address: %s";
      }
      else {
        sprintf(local_4e8,"Addr: %s (framing error)",local_2e8);
        AnalyzerResults::AddResultString
                  ((char *)this,local_4e8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        pcVar5 = "Address: %s (framing error)";
      }
LAB_0010c2e7:
      pcVar6 = local_4e8;
      sprintf(pcVar6,pcVar5,local_2e8);
    }
    AnalyzerResults::AddResultString
              ((char *)this,pcVar6,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_0010cff8;
  }
  AnalyzerHelpers::GetNumberString((ulong)uStack_1cc._3_1_,display_base,uVar9,local_4e8,0x80);
  uVar8 = ((ulong)uStack_1cc << 0x20) >> 0x30 & 0xff;
  AnalyzerHelpers::GetNumberString(uVar8,display_base,uVar9,local_468,0x80);
  uVar4 = (ulong)uStack_1cc & 0xffff;
  AnalyzerHelpers::GetNumberString(uVar4,display_base,uVar9,local_3e8,0x80);
  AnalyzerHelpers::GetNumberString((ulong)uStack_1ce,display_base,uVar9,local_368,0x80);
  AnalyzerHelpers::GetNumberString((ulong)local_1c8,display_base,uVar9,local_138,0x80);
  AnalyzerHelpers::GetNumberString((ulong)local_1c6,display_base,uVar9,local_b8,0x80);
  AnalyzerHelpers::GetNumberString((ulong)local_1d0,display_base,uVar9,local_1b8,0x80);
  memset(local_2e8,0,0x100);
  uVar7 = (undefined4)uVar8;
  if ((local_1bf & 0x40) != 0) {
    AnalyzerResults::AddResultString
              ((char *)this,local_468,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    switch(uVar7) {
    case 1:
      AnalyzerResults::AddResultString
                ((char *)this,"Read Coils",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Read Coils (%s), StartAddr: %s, Qty: %s, ChkSum: %s";
      break;
    case 2:
      AnalyzerResults::AddResultString
                ((char *)this,"Read Discrete Inputs",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                );
      pcVar6 = "DeviceID: %s, Func: Read Discrete Inputs (%s), StartAddr: %s, Qty: %s, ChkSum: %s";
      break;
    case 3:
      AnalyzerResults::AddResultString
                ((char *)this,"Read Holding Registers",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Holding Registers (%s), StartAddr: %s, Qty: %s, ChkSum: %s";
      break;
    case 4:
      AnalyzerResults::AddResultString
                ((char *)this,"Read Input Registers",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                );
      pcVar6 = "DeviceID: %s, Func: Input Registers (%s), StartAddr: %s, Qty: %s, ChkSum: %s";
      break;
    case 5:
      AnalyzerResults::AddResultString
                ((char *)this,"Write Single Coil",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Write Single Coil (%s), Addr: %s, Value: %s, ChkSum: %s";
      break;
    case 6:
      AnalyzerResults::AddResultString
                ((char *)this,"Write Single Register",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Write Single Register (%s), Addr: %s, Value: %s, ChkSum: %s";
      break;
    case 7:
      AnalyzerResults::AddResultString
                ((char *)this,"Read Exception Status",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Read Exception Status (%s), ChkSum: %s";
      goto LAB_0010cc00;
    case 8:
      if ((ushort)uStack_1cc < 0x15) {
        (*(code *)(&DAT_0011a2d0 + *(int *)(&DAT_0011a2d0 + uVar4 * 4)))();
        return;
      }
    default:
      goto switchD_0010c29c_caseD_9;
    case 0xb:
      AnalyzerResults::AddResultString
                ((char *)this,"Get Comm Event Counter",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Get Comm Event Counter (%s), ChkSum: %s";
      goto LAB_0010cc00;
    case 0xc:
      AnalyzerResults::AddResultString
                ((char *)this,"Get Comm Event Log",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Get Comm Event Log (%s), ChkSum: %s";
      goto LAB_0010cc00;
    case 0xf:
      AnalyzerResults::AddResultString
                ((char *)this,"Write Multiple Coils",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                );
      pcVar6 = 
      "DeviceID: %s, Func: Write Multiple Coils (%s), StartAddr: %s, Qty: %s, ByteCount: %s";
      break;
    case 0x10:
      AnalyzerResults::AddResultString
                ((char *)this,"Write Multiple Registers",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar6 = 
      "DeviceID: %s, Func: Write Multiple Registers (%s), StartAddr: %s, Qty: %s, ByteCount: %s";
      break;
    case 0x11:
      AnalyzerResults::AddResultString
                ((char *)this,"Report Server ID",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Report Server ID (%s), ChkSum: %s";
      goto LAB_0010cc00;
    case 0x14:
      AnalyzerResults::AddResultString
                ((char *)this,"Read File Record",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Read File Record (%s), ByteCount: %s";
      goto LAB_0010cc00;
    case 0x15:
      AnalyzerResults::AddResultString
                ((char *)this,"Write File Record",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Write File Record (%s), ByteCount: %s";
      goto LAB_0010cc00;
    case 0x16:
      AnalyzerResults::AddResultString
                ((char *)this,"Mask Write Register",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
      ;
      pcVar6 = 
      "DeviceID: %s, Func: Mask Write Register (%s), RefAddr: %s, And_Mask: %s, OR_Mask: %s, ChkSum: %s"
      ;
      break;
    case 0x17:
      AnalyzerResults::AddResultString
                ((char *)this,"Read/Write Multiple Registers",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar6 = 
      "DeviceID: %s, Func: Read/Write Multiple Registers (%s), ReadStartAddr: %s, ReadQty: %s, WriteStartAddr: %s, WriteQty: %s, ByteCount: %s"
      ;
      break;
    case 0x18:
      AnalyzerResults::AddResultString
                ((char *)this,"Read FIFO Queue",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "DeviceID: %s, Func: Read FIFO Queue (%s), Addr: %s, ChkSum: %s";
      goto LAB_0010cf72;
    case 0x2b:
      AnalyzerResults::AddResultString
                ((char *)this,"Read Device ID",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0010c811:
      pcVar6 = 
      "DeviceID: %s, Func: Read Device ID (%s), MEI: %s, ReadIDCode: %s, ObjID: %s, ChkSum: %s";
    }
    goto LAB_0010cb84;
  }
  if ((local_1bf & 2) == 0) {
    if ((local_1bf & 4) != 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"NAK",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      switch(uVar7) {
      case 0x81:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read Coils [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
        ;
        pcVar6 = "DeviceID: %s, Func: Read Coils [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x82:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read Discrete Inputs [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Read Discrete Inputs [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x83:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read Holding Registers [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Holding Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x84:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read Input Registers [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Input Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x85:
        AnalyzerResults::AddResultString
                  ((char *)this,"Write Single Coil [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Write Single Coil [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x86:
        AnalyzerResults::AddResultString
                  ((char *)this,"Write Single Register [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Write Single Register [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x87:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read Exception Status [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Read Exception Status [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x88:
        AnalyzerResults::AddResultString
                  ((char *)this,"Diagnostics [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                  );
        pcVar6 = "DeviceID: %s, Func: Diagnostics [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      default:
        AnalyzerResults::AddResultString
                  ((char *)this,"User Defined Function [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: User Defined Function [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x8b:
        AnalyzerResults::AddResultString
                  ((char *)this,"Get Comm Event Counter [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Get Comm Event Counter [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x8c:
        AnalyzerResults::AddResultString
                  ((char *)this,"Get Comm Event Log [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Get Comm Event Log [NACK] (%s), ExceptionCode: %s, ChkSum: %s"
        ;
        break;
      case 0x8f:
        AnalyzerResults::AddResultString
                  ((char *)this,"Write Multiple Coils [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Write Multiple Coils [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x90:
        AnalyzerResults::AddResultString
                  ((char *)this,"Write Multiple Registers [NACK]",(char *)0x0,(char *)0x0,
                   (char *)0x0,(char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Write Multiple Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x91:
        AnalyzerResults::AddResultString
                  ((char *)this,"Report Server ID [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Report Server ID [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x94:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read File Record [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Read File Record [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x95:
        AnalyzerResults::AddResultString
                  ((char *)this,"Write File Record [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Write File Record [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x96:
        AnalyzerResults::AddResultString
                  ((char *)this,"Mask Write Register [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Mask Write Register [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0x97:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read/Write Multiple Registers [NACK]",(char *)0x0,(char *)0x0,
                   (char *)0x0,(char *)0x0);
        pcVar6 = 
        "DeviceID: %s, Func: Read/Write Multiple Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s"
        ;
        break;
      case 0x98:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read FIFO Queue [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Read FIFO Queue [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
        break;
      case 0xab:
        AnalyzerResults::AddResultString
                  ((char *)this,"Read Device ID [NACK]",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0);
        pcVar6 = "DeviceID: %s, Func: Read Device ID [NACK] (%s), ExceptionCode: %s, ChkSum: %s";
      }
      goto LAB_0010cf72;
    }
    if ((local_1bf & 0x20) != 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"SubRequest Data",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar6 = "SubRequest - RefType: %s, FileNum: %s, RecordNum: %s, RecordLen: %s";
      pcVar5 = local_468;
      goto LAB_0010cf97;
    }
    if ((local_1bf & 8) == 0) {
      if ((local_1bf & 1) == 0) goto switchD_0010c29c_caseD_9;
      AnalyzerResults::AddResultString
                ((char *)this,local_1b8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"ChkSum",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar5 = " Checksum: %s";
      pcVar6 = local_1b8;
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,local_3e8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"Data",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar5 = "Value: %s";
      pcVar6 = local_3e8;
    }
    sprintf(local_2e8,pcVar5,pcVar6);
    goto switchD_0010c29c_caseD_9;
  }
  AnalyzerResults::AddResultString
            ((char *)this,local_468,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  switch(uVar7) {
  case 1:
    AnalyzerResults::AddResultString
              ((char *)this,"Read Coils [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Read Coils [ACK] (%s), ByteCount: %s";
    break;
  case 2:
    AnalyzerResults::AddResultString
              ((char *)this,"Read Discrete Inputs [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Read Discrete Inputs [ACK] (%s), ByteCount: %s";
    break;
  case 3:
    AnalyzerResults::AddResultString
              ((char *)this,"Read Holding Registers [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Holding Registers [ACK] (%s), ByteCount: %s";
    break;
  case 4:
    AnalyzerResults::AddResultString
              ((char *)this,"Read Input Registers [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Input Registers [ACK] (%s), ByteCount: %s";
    break;
  case 5:
    AnalyzerResults::AddResultString
              ((char *)this,"Write Single Coil [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Write Single Coil [ACK] (%s), Addr: %s, Value: %s, ChkSum: %s";
    goto LAB_0010cb84;
  case 6:
    AnalyzerResults::AddResultString
              ((char *)this,"Write Single Register [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Write Single Register [ACK] (%s), Addr: %s, Value: %s, ChkSum: %s"
    ;
    goto LAB_0010cb84;
  case 7:
    AnalyzerResults::AddResultString
              ((char *)this,"Read Exception Status [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Read Exception Status [ACK] (%s), Value: %s, ChkSum: %s";
LAB_0010cf72:
    pcVar5 = local_4e8;
    goto LAB_0010cf97;
  case 8:
    if ((ushort)uStack_1cc < 0x15) {
      (*(code *)(&DAT_0011a3d0 + *(int *)(&DAT_0011a3d0 + uVar4 * 4)))();
      return;
    }
  default:
    goto switchD_0010c29c_caseD_9;
  case 0xb:
    AnalyzerResults::AddResultString
              ((char *)this,"Get Comm Event Counter [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = 
    "DeviceID: %s, Func: Get Comm Event Counter [ACK] (%s), Status: %s, Count: %s, ChkSum: %s";
    goto LAB_0010cb84;
  case 0xc:
    AnalyzerResults::AddResultString
              ((char *)this,"Get Comm Event Log [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = 
    "DeviceID: %s, Func: Get Comm Event Log [ACK] (%s), Status: %s, EventCnt: %s, MsgCnt: %s, ByteCount: %s"
    ;
    pcVar5 = local_4e8;
    goto LAB_0010cf97;
  case 0xf:
    AnalyzerResults::AddResultString
              ((char *)this,"Write Multiple Coils [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = 
    "DeviceID: %s, Func: Write Multiple Coils [ACK] (%s), StartAddr: %s, Qty: %s, ChkSum: %s";
    goto LAB_0010cb84;
  case 0x10:
    AnalyzerResults::AddResultString
              ((char *)this,"Write Multiple Registers [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = 
    "DeviceID: %s, Func: Write Multiple Registers [ACK] (%s), StartAddr: %s, Qty: %s, ChkSum: %s";
    goto LAB_0010cb84;
  case 0x11:
    AnalyzerResults::AddResultString
              ((char *)this,"Report Server ID [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
              );
    pcVar6 = "DeviceID: %s, Func: Report Server ID [ACK] (%s), ByteCount: %s";
    break;
  case 0x14:
    AnalyzerResults::AddResultString
              ((char *)this,"Read File Record [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
              );
    pcVar6 = "DeviceID: %s, Func: Read File Record [ACK] (%s), ByteCount: %s";
    break;
  case 0x15:
    AnalyzerResults::AddResultString
              ((char *)this,"Write File Record [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Write File Record [ACK] (%s), ByteCount: %s";
    break;
  case 0x16:
    AnalyzerResults::AddResultString
              ((char *)this,"Mask Write Register [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar6 = 
    "DeviceID: %s, Func: Mask Write Register [ACK] (%s), RefAddr: %s, And_Mask: %s, OR_Mask: %s, ChkSum: %s"
    ;
    goto LAB_0010cb84;
  case 0x17:
    AnalyzerResults::AddResultString
              ((char *)this,"Read/Write Multiple Registers [ACK]",(char *)0x0,(char *)0x0,
               (char *)0x0,(char *)0x0);
    pcVar6 = "DeviceID: %s, Func: Read/Write Multiple Registers [ACK] (%s), ByteCount: %s";
    break;
  case 0x18:
    AnalyzerResults::AddResultString
              ((char *)this,"Read FIFO Queue [ACK]",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    pcVar6 = "DeviceID: %s, Func: Read FIFO Queue [ACK] (%s), ByteCount: %s, FIFO Count: %s";
LAB_0010cb84:
    pcVar5 = local_4e8;
LAB_0010cf97:
    sprintf(local_2e8,pcVar6,pcVar5);
    goto switchD_0010c29c_caseD_9;
  case 0x2b:
    AnalyzerResults::AddResultString
              ((char *)this,"Read Device ID",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_0010c811;
  }
LAB_0010cc00:
  sprintf(local_2e8,pcVar6,local_4e8);
switchD_0010c29c_caseD_9:
  if ((char)local_1bf < '\0') {
    sVar3 = strlen(local_2e8);
    *(undefined8 *)((long)auStack_2db + sVar3) = 0x29216d75736b63;
    builtin_strncpy(local_2e8 + sVar3," (Invali",8);
    builtin_strncpy(acStack_2e0 + sVar3,"d Checks",8);
  }
  AnalyzerResults::AddResultString
            ((char *)this,local_2e8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0010cff8:
  Frame::~Frame(local_1e0);
  return;
}

Assistant:

void ModbusAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                                DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    // we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by
    // AddChannelBubblesWillAppearOn)
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    bool framing_error = false;
    if( ( frame.mFlags & FRAMING_ERROR_FLAG ) != 0 )
        framing_error = true;

    bool parity_error = false;
    if( ( frame.mFlags & PARITY_ERROR_FLAG ) != 0 )
        parity_error = true;

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mModbusMode != ModbusAnalyzerEnums::Normal )
        bits_per_transfer--;

    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusASCIIClient ||
        mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusASCIIServer ||
        mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient || mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        char DeviceAddrStr[ 128 ];
        U8 DeviceAddr = ( frame.mData1 & 0xFF00000000000000 ) >> 56;
        AnalyzerHelpers::GetNumberString( DeviceAddr, display_base, bits_per_transfer, DeviceAddrStr, 128 );

        char FunctionCodeStr[ 128 ];
        U8 FunctionCode = ( frame.mData1 & 0x00FF000000000000 ) >> 48;
        AnalyzerHelpers::GetNumberString( FunctionCode, display_base, bits_per_transfer, FunctionCodeStr, 128 );

        char Payload1Str[ 128 ];
        U16 Payload1 = ( frame.mData1 & 0x0000FFFF00000000 ) >> 32;
        AnalyzerHelpers::GetNumberString( Payload1, display_base, bits_per_transfer, Payload1Str, 128 );

        char Payload2Str[ 128 ];
        U16 Payload2 = ( frame.mData1 & 0x00000000FFFF0000 ) >> 16;
        AnalyzerHelpers::GetNumberString( Payload2, display_base, bits_per_transfer, Payload2Str, 128 );

        char Payload3Str[ 128 ];
        U16 Payload3 = ( frame.mData2 & 0x000000000000FFFF );
        AnalyzerHelpers::GetNumberString( Payload3, display_base, bits_per_transfer, Payload3Str, 128 );

        char Payload4Str[ 128 ];
        U16 Payload4 = ( frame.mData2 & 0x00000000FFFF0000 ) >> 16;
        AnalyzerHelpers::GetNumberString( Payload4, display_base, bits_per_transfer, Payload4Str, 128 );

        char ChecksumStr[ 128 ];
        U16 Checksum = ( frame.mData1 & 0x000000000000FFFF );
        AnalyzerHelpers::GetNumberString( Checksum, display_base, bits_per_transfer, ChecksumStr, 128 );

        char result_str[ 256 ] = { '\0' };
        char Error_str[ 128 ] = { '\0' };
        if( frame.mFlags & FLAG_REQUEST_FRAME )
        {
            AddResultString( FunctionCodeStr );
            switch( FunctionCode )
            {
            case FUNCCODE_READ_COILS:
                AddResultString( "Read Coils" );
                sprintf( result_str, "DeviceID: %s, Func: Read Coils (%s), StartAddr: %s, Qty: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_READ_DISCRETE_INPUTS:
                AddResultString( "Read Discrete Inputs" );
                sprintf( result_str, "DeviceID: %s, Func: Read Discrete Inputs (%s), StartAddr: %s, Qty: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_READ_HOLDING_REGISTERS:
                AddResultString( "Read Holding Registers" );
                sprintf( result_str, "DeviceID: %s, Func: Holding Registers (%s), StartAddr: %s, Qty: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_READ_INPUT_REGISTER:
                AddResultString( "Read Input Registers" );
                sprintf( result_str, "DeviceID: %s, Func: Input Registers (%s), StartAddr: %s, Qty: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_SINGLE_COIL:
                AddResultString( "Write Single Coil" );
                sprintf( result_str, "DeviceID: %s, Func: Write Single Coil (%s), Addr: %s, Value: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_SINGLE_REGISTER:
                AddResultString( "Write Single Register" );
                sprintf( result_str, "DeviceID: %s, Func: Write Single Register (%s), Addr: %s, Value: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_READ_EXCEPTION_STATUS:
                AddResultString( "Read Exception Status" );
                sprintf( result_str, "DeviceID: %s, Func: Read Exception Status (%s), ChkSum: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_DIAGNOSTIC:

                switch( Payload1 )
                {
                case RETURN_QUERY_DATA:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Return Query Data" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Return Query Data (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RESTART_COMMUNICATIONS_OPTION:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Restart Comms Option" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Restart Comms Option (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_DIAGNOSTIC_REGISTER:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Return Diag Reg" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Return Diag Reg (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case CHANGE_ASCII_INPUT_DELIM:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Change ASCII Input Delim" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Change ASCII Input Delim (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case FORCE_LISTEN_ONLY_MODE:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Force Listen Only Mode" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Force Listen Only Mode (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case CLEAR_COUNTERS_AND_DIAG_REGISTER:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Clr Counters And Diag Reg" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Clr Counters And Diag Reg (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_MESSAGE_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Bus Msg Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Bus Msg Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_COMM_ERROR_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Bus Comm Err Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Bus Comm Err Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_EXCEPTION_ERROR_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Bus Excpt Err Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Bus Excpt Err Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_MESSAGE_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Server Msg Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Server Msg Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_NO_RESPONSE_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Server No Resp Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Server No Resp Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_NAK_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Server NAK Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Server NAK Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_BUSY_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Server Busy Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Server Busy Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_CHAR_OVERRUN_COUNT:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Bus Char Overrun Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Bus Char Overrun Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case CLEAR_OVERRUN_COUNTER_AND_FLAG:
                    AddResultString( "Diagnostics" );
                    AddResultString( "Diagnostics - Clear Overrun Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics (%s), SubFunc: Clear Overrun Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                }
                break;
            case FUNCCODE_GET_COM_EVENT_COUNTER:
                AddResultString( "Get Comm Event Counter" );
                sprintf( result_str, "DeviceID: %s, Func: Get Comm Event Counter (%s), ChkSum: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_GET_COM_EVENT_LOG:
                AddResultString( "Get Comm Event Log" );
                sprintf( result_str, "DeviceID: %s, Func: Get Comm Event Log (%s), ChkSum: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_WRITE_MULTIPLE_COILS:
                AddResultString( "Write Multiple Coils" );
                sprintf( result_str, "DeviceID: %s, Func: Write Multiple Coils (%s), StartAddr: %s, Qty: %s, ByteCount: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_MULTIPLE_REGISTERS:
                AddResultString( "Write Multiple Registers" );
                sprintf( result_str, "DeviceID: %s, Func: Write Multiple Registers (%s), StartAddr: %s, Qty: %s, ByteCount: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_REPORT_SERVER_ID:
                AddResultString( "Report Server ID" );
                sprintf( result_str, "DeviceID: %s, Func: Report Server ID (%s), ChkSum: %s", DeviceAddrStr, FunctionCodeStr, ChecksumStr );
                break;
            case FUNCCODE_READ_FILE_RECORD:
                AddResultString( "Read File Record" );
                sprintf( result_str, "DeviceID: %s, Func: Read File Record (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_WRITE_FILE_RECORD:
                AddResultString( "Write File Record" );
                sprintf( result_str, "DeviceID: %s, Func: Write File Record (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_MASK_WRITE_REGISTER:
                AddResultString( "Mask Write Register" );
                sprintf( result_str, "DeviceID: %s, Func: Mask Write Register (%s), RefAddr: %s, And_Mask: %s, OR_Mask: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, Payload3Str, ChecksumStr );
                break;
            case FUNCCODE_READWRITE_MULTIPLE_REGISTERS:
                AddResultString( "Read/Write Multiple Registers" );
                sprintf( result_str,
                         "DeviceID: %s, Func: Read/Write Multiple Registers (%s), ReadStartAddr: %s, ReadQty: %s, WriteStartAddr: %s, "
                         "WriteQty: %s, ByteCount: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, Payload4Str, Payload3Str, ChecksumStr );
                break;
            case FUNCCODE_READ_FIFO_QUEUE:
                AddResultString( "Read FIFO Queue" );
                sprintf( result_str, "DeviceID: %s, Func: Read FIFO Queue (%s), Addr: %s, ChkSum: %s", DeviceAddrStr, FunctionCodeStr,
                         Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_DEVICE_ID:
                AddResultString( "Read Device ID" );
                sprintf( result_str, "DeviceID: %s, Func: Read Device ID (%s), MEI: %s, ReadIDCode: %s, ObjID: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, Payload3Str, ChecksumStr );
                break;
            }
        }
        else if( frame.mFlags & FLAG_RESPONSE_FRAME )
        {
            AddResultString( FunctionCodeStr );
            switch( FunctionCode )
            {
            case FUNCCODE_READ_COILS:
                AddResultString( "Read Coils [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Coils [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_READ_DISCRETE_INPUTS:
                AddResultString( "Read Discrete Inputs [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Discrete Inputs [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_READ_HOLDING_REGISTERS:
                AddResultString( "Read Holding Registers [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Holding Registers [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_READ_INPUT_REGISTER:
                AddResultString( "Read Input Registers [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Input Registers [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_WRITE_SINGLE_COIL:
                AddResultString( "Write Single Coil [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Single Coil [ACK] (%s), Addr: %s, Value: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_SINGLE_REGISTER:
                AddResultString( "Write Single Register [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Single Register [ACK] (%s), Addr: %s, Value: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_READ_EXCEPTION_STATUS:
                AddResultString( "Read Exception Status [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Exception Status [ACK] (%s), Value: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_DIAGNOSTIC:

                switch( Payload1 )
                {
                case RETURN_QUERY_DATA:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Return Query Data" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Return Query Data (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RESTART_COMMUNICATIONS_OPTION:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK]- Restart Comms Option" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Restart Comms Option (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_DIAGNOSTIC_REGISTER:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Return Diag Reg" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Return Diag Reg (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case CHANGE_ASCII_INPUT_DELIM:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Change ASCII Input Delim" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Change ASCII Input Delim (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case FORCE_LISTEN_ONLY_MODE:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Force Listen Only Mode" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Force Listen Only Mode (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case CLEAR_COUNTERS_AND_DIAG_REGISTER:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Clr Counters And Diag Reg" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Clr Counters And Diag Reg (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_MESSAGE_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Bus Msg Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Bus Msg Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_COMM_ERROR_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Bus Comm Err Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Bus Comm Err Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_EXCEPTION_ERROR_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Bus Excpt Err Cnt" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Bus Excpt Err Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_MESSAGE_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Server Msg Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Server Msg Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_NO_RESPONSE_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Server No Resp Cnt" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Server No Resp Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_NAK_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Server NAK Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Server NAK Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_SERVER_BUSY_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Server Busy Cnt" );
                    sprintf( result_str, "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Server Busy Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case RETURN_BUS_CHAR_OVERRUN_COUNT:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Bus Char Overrun Cnt" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Bus Char Overrun Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                case CLEAR_OVERRUN_COUNTER_AND_FLAG:
                    AddResultString( "Diagnostics [ACK]" );
                    AddResultString( "Diagnostics [ACK] - Clear Overrun Cnt" );
                    sprintf( result_str,
                             "DeviceID: %s, Func: Diagnostics [ACK] (%s), SubFunc: Clear Overrun Cnt (%s), Data: %s, ChkSum: %s",
                             DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                    break;
                }
                break;
            case FUNCCODE_GET_COM_EVENT_COUNTER:
                AddResultString( "Get Comm Event Counter [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Get Comm Event Counter [ACK] (%s), Status: %s, Count: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_GET_COM_EVENT_LOG:
                AddResultString( "Get Comm Event Log [ACK]" );
                sprintf( result_str,
                         "DeviceID: %s, Func: Get Comm Event Log [ACK] (%s), Status: %s, EventCnt: %s, MsgCnt: %s, ByteCount: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload4Str, Payload3Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_MULTIPLE_COILS:
                AddResultString( "Write Multiple Coils [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Multiple Coils [ACK] (%s), StartAddr: %s, Qty: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_MULTIPLE_REGISTERS:
                AddResultString( "Write Multiple Registers [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Multiple Registers [ACK] (%s), StartAddr: %s, Qty: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, ChecksumStr );
                break;
            case FUNCCODE_REPORT_SERVER_ID:
                AddResultString( "Report Server ID [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Report Server ID [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_READ_FILE_RECORD:
                AddResultString( "Read File Record [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read File Record [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_WRITE_FILE_RECORD:
                AddResultString( "Write File Record [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write File Record [ACK] (%s), ByteCount: %s", DeviceAddrStr, FunctionCodeStr,
                         ChecksumStr );
                break;
            case FUNCCODE_MASK_WRITE_REGISTER:
                AddResultString( "Mask Write Register [ACK]" );
                sprintf( result_str,
                         "DeviceID: %s, Func: Mask Write Register [ACK] (%s), RefAddr: %s, And_Mask: %s, OR_Mask: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, Payload3Str, ChecksumStr );
                break;
            case FUNCCODE_READWRITE_MULTIPLE_REGISTERS:
                AddResultString( "Read/Write Multiple Registers [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read/Write Multiple Registers [ACK] (%s), ByteCount: %s", DeviceAddrStr,
                         FunctionCodeStr, ChecksumStr );
                break;
            case FUNCCODE_READ_FIFO_QUEUE:
                AddResultString( "Read FIFO Queue [ACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read FIFO Queue [ACK] (%s), ByteCount: %s, FIFO Count: %s", DeviceAddrStr,
                         FunctionCodeStr, ChecksumStr, Payload2Str );
                break;
            case FUNCCODE_READ_DEVICE_ID:
                AddResultString( "Read Device ID" );
                sprintf( result_str, "DeviceID: %s, Func: Read Device ID (%s), MEI: %s, ReadIDCode: %s, ObjID: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, Payload2Str, Payload3Str, ChecksumStr );
                break;
            }
        }
        else if( frame.mFlags & FLAG_EXCEPTION_FRAME )
        {
            AddResultString( "NAK" );
            switch( FunctionCode - 0x80 )
            {
            case FUNCCODE_READ_COILS:
                AddResultString( "Read Coils [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Coils [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_DISCRETE_INPUTS:
                AddResultString( "Read Discrete Inputs [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Discrete Inputs [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_HOLDING_REGISTERS:
                AddResultString( "Read Holding Registers [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Holding Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_INPUT_REGISTER:
                AddResultString( "Read Input Registers [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Input Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_SINGLE_COIL:
                AddResultString( "Write Single Coil [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Single Coil [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_SINGLE_REGISTER:
                AddResultString( "Write Single Register [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Single Register [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_EXCEPTION_STATUS:
                AddResultString( "Read Exception Status [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Exception Status [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_DIAGNOSTIC:
                AddResultString( "Diagnostics [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Diagnostics [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_GET_COM_EVENT_COUNTER:
                AddResultString( "Get Comm Event Counter [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Get Comm Event Counter [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_GET_COM_EVENT_LOG:
                AddResultString( "Get Comm Event Log [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Get Comm Event Log [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_MULTIPLE_COILS:
                AddResultString( "Write Multiple Coils [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Multiple Coils [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_MULTIPLE_REGISTERS:
                AddResultString( "Write Multiple Registers [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write Multiple Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_REPORT_SERVER_ID:
                AddResultString( "Report Server ID [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Report Server ID [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_FILE_RECORD:
                AddResultString( "Read File Record [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read File Record [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_WRITE_FILE_RECORD:
                AddResultString( "Write File Record [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Write File Record [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_MASK_WRITE_REGISTER:
                AddResultString( "Mask Write Register [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Mask Write Register [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READWRITE_MULTIPLE_REGISTERS:
                AddResultString( "Read/Write Multiple Registers [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read/Write Multiple Registers [NACK] (%s), ExceptionCode: %s, ChkSum: %s",
                         DeviceAddrStr, FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_FIFO_QUEUE:
                AddResultString( "Read FIFO Queue [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read FIFO Queue [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            case FUNCCODE_READ_DEVICE_ID:
                AddResultString( "Read Device ID [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: Read Device ID [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            default:
                AddResultString( "User Defined Function [NACK]" );
                sprintf( result_str, "DeviceID: %s, Func: User Defined Function [NACK] (%s), ExceptionCode: %s, ChkSum: %s", DeviceAddrStr,
                         FunctionCodeStr, Payload1Str, ChecksumStr );
                break;
            }
        }
        else if( frame.mFlags & FLAG_FILE_SUBREQ )
        {
            AddResultString( "SubRequest Data" );
            sprintf( result_str, "SubRequest - RefType: %s, FileNum: %s, RecordNum: %s, RecordLen: %s", FunctionCodeStr, Payload1Str,
                     Payload2Str, ChecksumStr );
        }
        else if( frame.mFlags & FLAG_DATA_FRAME )
        {
            AddResultString( Payload1Str );
            AddResultString( "Data" );
            sprintf( result_str, "Value: %s", Payload1Str );
        }
        else if( frame.mFlags & FLAG_END_FRAME )
        {
            AddResultString( ChecksumStr );
            AddResultString( "ChkSum" );
            sprintf( result_str, " Checksum: %s", ChecksumStr );
        }

        if( frame.mFlags & FLAG_CHECKSUM_ERROR )
            strcat( result_str, " (Invalid Checksum!)" );

        AddResultString( result_str );
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, bits_per_transfer, number_str, 128 );

        char result_str[ 128 ];

        // MP mode address case:
        bool mp_mode_address_flag = false;
        if( ( frame.mFlags & MP_MODE_ADDRESS_FLAG ) != 0 )
        {
            mp_mode_address_flag = true;

            AddResultString( "A" );
            AddResultString( "Addr" );

            if( framing_error == false )
            {
                sprintf( result_str, "Addr: %s", number_str );
                AddResultString( result_str );

                sprintf( result_str, "Address: %s", number_str );
                AddResultString( result_str );
            }
            else
            {
                sprintf( result_str, "Addr: %s (framing error)", number_str );
                AddResultString( result_str );

                sprintf( result_str, "Address: %s (framing error)", number_str );
                AddResultString( result_str );
            }
            return;
        }

        // normal case:
        if( ( parity_error == true ) || ( framing_error == true ) )
        {
            AddResultString( "!" );

            sprintf( result_str, "%s (error)", number_str );
            AddResultString( result_str );

            if( parity_error == true && framing_error == false )
                sprintf( result_str, "%s (parity error)", number_str );
            else if( parity_error == false && framing_error == true )
                sprintf( result_str, "%s (framing error)", number_str );
            else
                sprintf( result_str, "%s (framing error & parity error)", number_str );

            AddResultString( result_str );
        }
        else
        {
            AddResultString( number_str );
        }
    }
}